

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logs.c
# Opt level: O1

void lwsl_hexdump_level(int hexdump_level,void *vbuf,size_t len)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  char line [80];
  ulong local_98;
  char local_88 [88];
  
  if ((log_level & hexdump_level) != 0) {
    if (len == 0) {
      _lws_log(hexdump_level,"(hexdump: zero length)\n");
      return;
    }
    if (vbuf == (void *)0x0) {
      _lws_log(hexdump_level,"(hexdump: trying to dump %d at NULL)\n",len & 0xffffffff);
      return;
    }
    _lws_log(hexdump_level,"\n");
    local_98 = 0;
    do {
      iVar2 = lws_snprintf(local_88,10,"%04X: ",local_98);
      pcVar7 = local_88 + iVar2;
      iVar2 = (int)local_98;
      if (local_98 < len) {
        uVar10 = 0;
        do {
          iVar3 = lws_snprintf(pcVar7,5,"%02X ",(ulong)*(byte *)((long)vbuf + local_98));
          pcVar7 = pcVar7 + iVar3;
          uVar6 = uVar10 + 1;
          if (0xe < uVar10) break;
          local_98 = (ulong)(iVar2 + uVar10 + 1);
          uVar10 = uVar6;
        } while (local_98 < len);
        local_98 = (ulong)(iVar2 + uVar6);
      }
      else {
        uVar6 = 0;
      }
      if (uVar6 < 0x10) {
        iVar3 = uVar6 - 0x10;
        do {
          iVar4 = lws_snprintf(pcVar7,5,"   ");
          pcVar7 = pcVar7 + iVar4;
          iVar3 = iVar3 + 1;
        } while (iVar3 != 0);
      }
      iVar3 = lws_snprintf(pcVar7,6,"   ");
      lVar9 = 0;
      do {
        uVar5 = (ulong)(uint)(iVar2 + (int)lVar9);
        lVar8 = lVar9;
        if (len <= uVar5) goto LAB_00110127;
        cVar1 = *(char *)((long)vbuf + uVar5);
        if (0x5e < (byte)(cVar1 - 0x20U)) {
          cVar1 = '.';
        }
        pcVar7[lVar9 + iVar3] = cVar1;
        lVar8 = lVar9 + 1;
        lVar9 = lVar8;
      } while (lVar8 != 0x10);
      lVar9 = 0x10;
LAB_00110127:
      pcVar7 = pcVar7 + lVar8 + iVar3;
      uVar6 = (uint)lVar9;
      if (uVar6 < 0x10) {
        memset(pcVar7,0x20,(ulong)(0x10 - uVar6));
        pcVar7 = pcVar7 + (ulong)(0xf - uVar6) + 1;
      }
      pcVar7[0] = '\n';
      pcVar7[1] = '\0';
      _lws_log(hexdump_level,"%s",local_88);
    } while (local_98 < len);
    _lws_log(hexdump_level,"\n");
  }
  return;
}

Assistant:

void
lwsl_hexdump_level(int hexdump_level, const void *vbuf, size_t len)
{
	unsigned char *buf = (unsigned char *)vbuf;
	unsigned int n;

	if (!lwsl_visible(hexdump_level))
		return;

	if (!len) {
		_lws_log(hexdump_level, "(hexdump: zero length)\n");
		return;
	}

	if (!vbuf) {
		_lws_log(hexdump_level, "(hexdump: trying to dump %d at NULL)\n",
					(int)len);
		return;
	}

	_lws_log(hexdump_level, "\n");

	for (n = 0; n < len;) {
		unsigned int start = n, m;
		char line[80], *p = line;

		p += lws_snprintf(p, 10, "%04X: ", start);

		for (m = 0; m < 16 && n < len; m++)
			p += lws_snprintf(p, 5, "%02X ", buf[n++]);
		while (m++ < 16)
			p += lws_snprintf(p, 5, "   ");

		p += lws_snprintf(p, 6, "   ");

		for (m = 0; m < 16 && (start + m) < len; m++) {
			if (buf[start + m] >= ' ' && buf[start + m] < 127)
				*p++ = buf[start + m];
			else
				*p++ = '.';
		}
		while (m++ < 16)
			*p++ = ' ';

		*p++ = '\n';
		*p = '\0';
		_lws_log(hexdump_level, "%s", line);
		(void)line;
	}

	_lws_log(hexdump_level, "\n");
}